

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_class_decl(gvisitor_t *self,gnode_class_decl_t *node)

{
  long lVar1;
  long lVar2;
  gravity_class_t *baseclass;
  gnode_t *pgVar3;
  char *identifier;
  void *pvVar4;
  void *pvVar5;
  gnode_t *local_70;
  gnode_t *local_68;
  long local_60;
  long local_58;
  gnode_t *val;
  size_t _i;
  size_t _len;
  codegen_t *data;
  gnode_class_decl_t *super;
  gravity_class_t *c;
  gnode_class_decl_t *node_local;
  gvisitor_t *self_local;
  
  if (node->storage != TOK_KEY_EXTERN) {
    baseclass = gravity_class_new_pair
                          (*(gravity_vm **)((long)self->data + 0x38),node->identifier,
                           (gravity_class_t *)0x0,node->nivar,node->nsvar);
    baseclass->is_struct = (_Bool)(node->is_struct & 1);
    if (node->superclass != (gnode_t *)0x0) {
      if ((node->superclass == (gnode_t *)0x0) || (node->superclass->tag != NODE_CLASS_DECL)) {
        pgVar3 = gnode2class(node->superclass,&node->super_extern);
        node->superclass = pgVar3;
        if (node->superclass == (gnode_t *)0x0) {
          report_error(self,&node->base,"Unable to set superclass to non class object.");
        }
      }
      else {
        node->super_extern = node->superclass[1].token.lineno == 0x1f;
      }
      if ((node->super_extern & 1U) == 0) {
        pgVar3 = node->superclass;
        lVar1._0_4_ = pgVar3[2].tag;
        lVar1._4_4_ = pgVar3[2].refcount;
        if (lVar1 == 0) {
          pvVar5 = self->data;
          node->data = baseclass;
          if (*(long *)((long)pvVar5 + 0x18) == *(long *)((long)pvVar5 + 0x20)) {
            if (*(long *)((long)pvVar5 + 0x20) == 0) {
              local_58 = 8;
            }
            else {
              local_58 = *(long *)((long)pvVar5 + 0x20) << 1;
            }
            *(long *)((long)pvVar5 + 0x20) = local_58;
            pvVar4 = realloc(*(void **)((long)pvVar5 + 0x28),*(long *)((long)pvVar5 + 0x20) << 3);
            *(void **)((long)pvVar5 + 0x28) = pvVar4;
          }
          lVar1 = *(long *)((long)pvVar5 + 0x18);
          *(long *)((long)pvVar5 + 0x18) = lVar1 + 1;
          *(gnode_class_decl_t **)(*(long *)((long)pvVar5 + 0x28) + lVar1 * 8) = node;
        }
        else {
          gravity_class_setsuper(baseclass,*(gravity_class_t **)(pgVar3 + 2));
        }
      }
      else {
        identifier = gnode_identifier(node->superclass);
        gravity_class_setsuper_extern(baseclass,identifier);
      }
    }
    if (*self->data == *(long *)((long)self->data + 8)) {
      if (*(long *)((long)self->data + 8) == 0) {
        local_60 = 8;
      }
      else {
        local_60 = *(long *)((long)self->data + 8) << 1;
      }
      *(long *)((long)self->data + 8) = local_60;
      pvVar5 = realloc(*(void **)((long)self->data + 0x10),*(long *)((long)self->data + 8) << 3);
      *(void **)((long)self->data + 0x10) = pvVar5;
    }
    lVar1 = *(long *)((long)self->data + 0x10);
    lVar2 = *self->data;
    *(long *)self->data = lVar2 + 1;
    *(gravity_class_t **)(lVar1 + lVar2 * 8) = baseclass;
    if (node->decls == (gnode_r *)0x0) {
      local_68 = (gnode_t *)0x0;
    }
    else {
      local_68 = (gnode_t *)node->decls->n;
    }
    for (val = (gnode_t *)0x0; val < local_68; val = (gnode_t *)((long)&val->tag + 1)) {
      if (val < (gnode_t *)node->decls->n) {
        local_70 = node->decls->p[(long)val];
      }
      else {
        local_70 = (gnode_t *)0x0;
      }
      gvisit(self,local_70);
    }
    *(long *)self->data = *self->data + -1;
    process_constructor(self,baseclass,&node->base);
    store_declaration(self,baseclass,node->storage == TOK_KEY_STATIC,(gnode_function_decl_t *)0x0);
    node->data = baseclass;
  }
  return;
}

Assistant:

static void visit_class_decl (gvisitor_t *self, gnode_class_decl_t *node) {
    DEBUG_CODEGEN("visit_class_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    // create a new pair of classes (class itself and its meta)
    gravity_class_t *c = gravity_class_new_pair(GET_VM(), node->identifier, NULL, node->nivar, node->nsvar);

    // mark the class as a struct
    c->is_struct = node->is_struct;
    
    // check if class has a declared superclass
    if (node->superclass) {
        // node->superclass should be a gnode_class_decl_t at this point
        if (NODE_ISA_CLASS(node->superclass)) {
            node->super_extern = (((gnode_class_decl_t *)node->superclass)->storage == TOK_KEY_EXTERN);
        } else {
            node->superclass = gnode2class((gnode_t*)node->superclass, &node->super_extern);
            if (!node->superclass) report_error(self, (gnode_t*)node, "Unable to set superclass to non class object.");
        }
        
        if (node->super_extern) {
            gravity_class_setsuper_extern(c, gnode_identifier((gnode_t*)node->superclass));
        } else {
            gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;
            if (super->data) {
                // means that superclass has already been processed and its runtime representation is available
                gravity_class_setsuper(c, (gravity_class_t *)super->data);
            } else {
                // superclass has not yet processed so we need recheck the node at the end of the visit
                // add node to superfix for later processing
                codegen_t *data = (codegen_t *)self->data;
                node->data = (void *)c;
                marray_push(gnode_class_decl_t *, data->superfix, node);
            }
        }
    }

    CONTEXT_PUSH(c);

    // process inner declarations
    gnode_array_each(node->decls, {visit(val);});

    // adjust declaration stack
    CONTEXT_POP();

    // fix constructor chain
    process_constructor(self, c, (gnode_t *)node);

    // store class declaration in current context
    store_declaration(self, (gravity_object_t *)c, (node->storage == TOK_KEY_STATIC), NULL);

    // save runtime representation
    // since this class could be a superclass of another class
    // then save opaque gravity_class_t pointer to node->data
    node->data = (void *)c;
}